

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsNan(ON_Xform *this)

{
  double dVar1;
  double t;
  double *x16;
  double *x;
  ON_Xform *this_local;
  
  x16 = (double *)this;
  do {
    if (this + 1 <= x16) {
      return false;
    }
    dVar1 = *x16;
    x16 = x16 + 1;
  } while (!NAN(dVar1));
  return true;
}

Assistant:

bool ON_Xform::IsNan() const
{
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  while ( x < x16 )
  {
    const double t = *x++;
    if (!(t == t))
      return true; // t is a nan
  }
  return false;
}